

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void lj_snap_add(jit_State *J)

{
  uint uVar1;
  uint uVar2;
  uint nsnapmap_00;
  SnapShot *in_RDI;
  MSize nsnapmap;
  MSize nsnap;
  MSize in_stack_ffffffffffffffcc;
  undefined4 uVar3;
  ushort in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe2;
  undefined2 in_stack_ffffffffffffffe4;
  undefined2 in_stack_ffffffffffffffe6;
  
  nsnapmap_00 = (uint)in_RDI->mcofs;
  uVar3._0_2_ = in_RDI[2].ref;
  uVar3._2_2_ = in_RDI[2].mcofs;
  if (((nsnapmap_00 != 0) &&
      (uVar1._0_1_ = in_RDI->nslots, uVar1._1_1_ = in_RDI->topslot, uVar1._2_1_ = in_RDI->nent,
      uVar1._3_1_ = in_RDI->count,
      *(ushort *)(*(long *)&in_RDI[2].nslots + (ulong)(nsnapmap_00 - 1) * 0xc + 4) == uVar1)) ||
     (((char)in_RDI[0xd].mapofs != '\0' && ((in_RDI[0xd].mapofs & 0x800000) == 0)))) {
    if (nsnapmap_00 != 1) {
      nsnapmap_00 = nsnapmap_00 - 1;
      goto LAB_001a86a9;
    }
    in_stack_ffffffffffffffe6 = 0xc00;
    in_stack_ffffffffffffffe4 = 0;
    in_stack_ffffffffffffffe2 = 0;
    in_RDI[0xd].nslots = '\0';
    in_RDI[0xd].topslot = '\f';
    in_RDI[0xd].ref = 0;
    in_RDI[0xd].mcofs = 0;
    lj_ir_emit((jit_State *)CONCAT26(0xc00,(uint6)in_stack_ffffffffffffffe0));
  }
  uVar2._0_1_ = in_RDI[0x1b].nslots;
  uVar2._1_1_ = in_RDI[0x1b].topslot;
  uVar2._2_1_ = in_RDI[0x1b].nent;
  uVar2._3_1_ = in_RDI[0x1b].count;
  if (uVar2 < nsnapmap_00 + 1) {
    lj_snap_grow_buf_((jit_State *)CONCAT44(nsnapmap_00,uVar3),in_stack_ffffffffffffffcc);
  }
  in_RDI->mcofs = (short)nsnapmap_00 + 1;
LAB_001a86a9:
  *(undefined1 *)&in_RDI[0xd].mapofs = 0;
  *(undefined1 *)((long)&in_RDI[0xd].mapofs + 2) = 0;
  snapshot_stack((jit_State *)
                 CONCAT26(in_stack_ffffffffffffffe6,
                          CONCAT24(in_stack_ffffffffffffffe4,
                                   CONCAT22(in_stack_ffffffffffffffe2,in_stack_ffffffffffffffe0))),
                 in_RDI,nsnapmap_00);
  return;
}

Assistant:

void lj_snap_add(jit_State *J)
{
  MSize nsnap = J->cur.nsnap;
  MSize nsnapmap = J->cur.nsnapmap;
  /* Merge if no ins. inbetween or if requested and no guard inbetween. */
  if ((nsnap > 0 && J->cur.snap[nsnap-1].ref == J->cur.nins) ||
      (J->mergesnap && !irt_isguard(J->guardemit))) {
    if (nsnap == 1) {  /* But preserve snap #0 PC. */
      emitir_raw(IRT(IR_NOP, IRT_NIL), 0, 0);
      goto nomerge;
    }
    nsnapmap = J->cur.snap[--nsnap].mapofs;
  } else {
  nomerge:
    lj_snap_grow_buf(J, nsnap+1);
    J->cur.nsnap = (uint16_t)(nsnap+1);
  }
  J->mergesnap = 0;
  J->guardemit.irt = 0;
  snapshot_stack(J, &J->cur.snap[nsnap], nsnapmap);
}